

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_at_one.cpp
# Opt level: O3

ulong parse_arg(int argc,char **argv)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  ulong uVar3;
  runtime_error *this;
  undefined8 uVar4;
  allocator local_51;
  char *local_50 [2];
  char local_40 [16];
  char *local_30;
  
  if (argc < 2) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Incorrect input");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)local_50,argv[1],&local_51);
  __nptr = local_50[0];
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  uVar3 = strtoul(__nptr,&local_30,10);
  if (local_30 == __nptr) {
    uVar4 = std::__throw_invalid_argument("stoul");
    __cxa_free_exception();
    _Unwind_Resume(uVar4);
  }
  if (*piVar2 != 0) {
    if (*piVar2 != 0x22) goto LAB_00102438;
    std::__throw_out_of_range("stoul");
  }
  *piVar2 = iVar1;
LAB_00102438:
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return uVar3;
}

Assistant:

ulong parse_arg(int argc, char *argv[]){
  ulong res;
  if(argc  < 2)
    throw std::runtime_error("Incorrect input");
  try{
    res = std::stoul(argv[1]);
  }catch(...){
    throw std::runtime_error("Parsing failed");
  }
  return res;
}